

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O3

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  
  sVar2 = 0;
  if (timeout_mclks == 0) {
    return 0;
  }
  uVar3 = timeout_mclks - 1;
  if (0x100 < timeout_mclks) {
    sVar2 = 0;
    uVar4 = uVar3;
    do {
      uVar3 = uVar4 >> 1;
      sVar2 = sVar2 + 0x100;
      bVar1 = 0x1ff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  return (short)uVar3 + sVar2;
}

Assistant:

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)
{
  // encoded format: "(LSByte * 2^MSByte) + 1"

  uint32_t ls_byte = 0;
  uint16_t ms_byte = 0;

  if (timeout_mclks > 0)
  {
    ls_byte = timeout_mclks - 1;

    while ((ls_byte & 0xFFFFFF00) > 0)
    {
      ls_byte >>= 1;
      ms_byte++;
    }

    return (ms_byte << 8) | (ls_byte & 0xFF);
  }
  else { return 0; }
}